

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O3

void glad_debug_impl_glUniform4f(GLint arg0,GLfloat arg1,GLfloat arg2,GLfloat arg3,GLfloat arg4)

{
  (*_pre_call_callback)("glUniform4f",glad_debug_glUniform4f,5,arg0);
  (*glad_glUniform4f)(arg0,arg1,arg2,arg3,arg4);
  (*_post_call_callback)
            ("glUniform4f",glad_debug_glUniform4f,5,(double)arg1,(double)arg2,(double)arg3,
             (double)arg4,arg0,_post_call_callback);
  return;
}

Assistant:

void APIENTRY glad_debug_impl_glUniform4f(GLint arg0, GLfloat arg1, GLfloat arg2, GLfloat arg3, GLfloat arg4) {    
    _pre_call_callback("glUniform4f", (void*)glUniform4f, 5, arg0, arg1, arg2, arg3, arg4);
     glad_glUniform4f(arg0, arg1, arg2, arg3, arg4);
    _post_call_callback("glUniform4f", (void*)glUniform4f, 5, arg0, arg1, arg2, arg3, arg4);
    
}